

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLIFilePartLoader.cpp
# Opt level: O2

UniqueId * __thiscall
COLLADASaxFWL::IFilePartLoader::createUniqueIdFromUrl
          (IFilePartLoader *this,ParserChar *url,ClassId classId)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 *puVar2;
  URI uri;
  allocator<char> local_129;
  String local_128;
  URI local_108;
  
  puVar2 = COLLADAFW::UniqueId::INVALID;
  if ((url != (ParserChar *)0x0) && (*url != '\0')) {
    iVar1 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[0xb])();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,url,&local_129);
    COLLADABU::URI::URI(&local_108,(URI *)CONCAT44(extraout_var,iVar1),&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    iVar1 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[7])(this);
    puVar2 = (undefined1 *)
             Loader::getUniqueId((Loader *)CONCAT44(extraout_var_00,iVar1),&local_108,classId);
    COLLADABU::URI::~URI(&local_108);
  }
  return (UniqueId *)puVar2;
}

Assistant:

const COLLADAFW::UniqueId& IFilePartLoader::createUniqueIdFromUrl( const ParserChar* url, COLLADAFW::ClassId classId )
	{
		COLLADABU_ASSERT( getColladaLoader() );
		if ( !url || !(*url) )
			return COLLADAFW::UniqueId::INVALID;

		COLLADABU::URI uri(getFileUri(), String((const char *)url));

		return getColladaLoader()->getUniqueId(uri, classId);
	}